

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

int __thiscall pbrt::TranslucentMaterial::writeTo(TranslucentMaterial *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  int32_t local_2c;
  __shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  BinaryWriter::write(binary,(int)this + 0x18,in_RDX,in_RCX);
  std::__shared_ptr<pbrt::Entity,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<pbrt::Texture,void>
            (local_28,&(this->map_kd).super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)
  ;
  local_2c = BinaryWriter::serialize(binary,(SP *)local_28);
  BinaryWriter::write<int>(binary,&local_2c);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->reflect);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->transmit);
  BinaryWriter::write<pbrt::math::vec3f>(binary,&this->kd);
  return 0x16;
}

Assistant:

int TranslucentMaterial::writeTo(BinaryWriter &binary) 
  {
    Material::writeTo(binary);
    binary.write(binary.serialize(map_kd));
    binary.write(reflect);
    binary.write(transmit);
    binary.write(kd);
    return TYPE_TRANSLUCENT_MATERIAL;
  }